

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamStandardIndex::Jump
          (BamStandardIndex *this,BamRegion *region,bool *hasAlignmentsInRegion)

{
  BamReaderPrivate *this_00;
  bool bVar1;
  int64_t offset;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  *hasAlignmentsInRegion = false;
  this_00 = (this->super_BamIndex).m_reader;
  if ((this_00 != (BamReaderPrivate *)0x0) && (bVar1 = BamReaderPrivate::IsOpen(this_00), bVar1)) {
    GetOffset(this,region,(int64_t *)&local_58,hasAlignmentsInRegion);
    if (*hasAlignmentsInRegion != true) {
      return true;
    }
    bVar1 = BamReaderPrivate::Seek((this->super_BamIndex).m_reader,(int64_t *)&local_58);
    return bVar1;
  }
  std::__cxx11::string::string((string *)&local_58,"BamStandardIndex::Jump",&local_59);
  std::__cxx11::string::string((string *)&local_38,"could not jump: reader is not open",&local_5a);
  BamIndex::SetErrorString(&this->super_BamIndex,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return false;
}

Assistant:

bool BamStandardIndex::Jump(const BamRegion& region, bool* hasAlignmentsInRegion)
{

    // clear out flag
    *hasAlignmentsInRegion = false;

    // skip if invalid reader or not open
    if (m_reader == 0 || !m_reader->IsOpen()) {
        SetErrorString("BamStandardIndex::Jump", "could not jump: reader is not open");
        return false;
    }

    // calculate nearest offset to jump to
    int64_t offset;
    try {
        GetOffset(region, offset, hasAlignmentsInRegion);
    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // if region has alignments, return success/fail of seeking there
    if (*hasAlignmentsInRegion) return m_reader->Seek(offset);

    // otherwise, simply return true (but hasAlignmentsInRegion flag has been set to false)
    // (this is OK, BamReader will check this flag before trying to load data)
    return true;
}